

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::ExpandSpecialVariable
          (cmCommandArgumentParserHelper *this,char *key,char *var)

{
  undefined8 __s;
  bool bVar1;
  int iVar2;
  cmState *this_00;
  string *str_00;
  ostream *poVar3;
  string local_268;
  ostringstream local_248 [8];
  ostringstream e;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string *local_88;
  string *c;
  string local_78;
  undefined1 local_48 [8];
  string str;
  char *var_local;
  char *key_local;
  cmCommandArgumentParserHelper *this_local;
  
  str.field_2._8_8_ = var;
  if (key == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)ExpandVariable(this,var);
  }
  else if (var == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)0x8d3ee0;
  }
  else {
    iVar2 = strcmp(key,"ENV");
    if (iVar2 == 0) {
      std::__cxx11::string::string((string *)local_48);
      bVar1 = cmsys::SystemTools::GetEnv((char *)str.field_2._8_8_,(string *)local_48);
      if (bVar1) {
        if ((this->EscapeQuotes & 1U) == 0) {
          this_local = (cmCommandArgumentParserHelper *)AddString(this,(string *)local_48);
        }
        else {
          cmSystemTools::EscapeQuotes(&local_78,(string *)local_48);
          this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
      }
      else {
        this_local = (cmCommandArgumentParserHelper *)0x8d3ee0;
      }
      c._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_48);
    }
    else {
      iVar2 = strcmp(key,"CACHE");
      if (iVar2 == 0) {
        this_00 = cmMakefile::GetState(this->Makefile);
        __s = str.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,(char *)__s,&local_a9);
        str_00 = cmState::GetInitializedCacheValue(this_00,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator(&local_a9);
        if (str_00 == (string *)0x0) {
          this_local = (cmCommandArgumentParserHelper *)0x8d3ee0;
        }
        else {
          local_88 = str_00;
          if ((this->EscapeQuotes & 1U) == 0) {
            this_local = (cmCommandArgumentParserHelper *)AddString(this,str_00);
          }
          else {
            cmSystemTools::EscapeQuotes(&local_d0,str_00);
            this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_248);
        poVar3 = std::operator<<((ostream *)local_248,"Syntax $");
        poVar3 = std::operator<<(poVar3,key);
        poVar3 = std::operator<<(poVar3,"{} is not supported.  ");
        std::operator<<(poVar3,"Only ${}, $ENV{}, and $CACHE{} are allowed.");
        std::__cxx11::ostringstream::str();
        SetError(this,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        this_local = (cmCommandArgumentParserHelper *)0x0;
        c._4_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream(local_248);
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandSpecialVariable(
  const char* key, const char* var)
{
  if (!key) {
    return this->ExpandVariable(var);
  }
  if (!var) {
    return "";
  }
  if (strcmp(key, "ENV") == 0) {
    std::string str;
    if (cmSystemTools::GetEnv(var, str)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmSystemTools::EscapeQuotes(str));
      }
      return this->AddString(str);
    }
    return "";
  }
  if (strcmp(key, "CACHE") == 0) {
    if (const std::string* c =
          this->Makefile->GetState()->GetInitializedCacheValue(var)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmSystemTools::EscapeQuotes(*c));
      }
      return this->AddString(*c);
    }
    return "";
  }
  std::ostringstream e;
  e << "Syntax $" << key << "{} is not supported.  "
    << "Only ${}, $ENV{}, and $CACHE{} are allowed.";
  this->SetError(e.str());
  return nullptr;
}